

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::Glob(string *directory,string *regexp,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *files)

{
  bool bVar1;
  char *pcVar2;
  unsigned_long uVar3;
  allocator local_139;
  undefined1 local_138 [8];
  string fname;
  uint i;
  size_t numf;
  undefined1 local_f8 [8];
  RegularExpression reg;
  Directory d;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *regexp_local;
  string *directory_local;
  
  cmsys::Directory::Directory((Directory *)&reg.searchstring);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_f8,pcVar2);
  bVar1 = cmsys::Directory::Load((Directory *)&reg.searchstring,directory);
  if (bVar1) {
    uVar3 = cmsys::Directory::GetNumberOfFiles((Directory *)&reg.searchstring);
    for (fname.field_2._12_4_ = 0; (uint)fname.field_2._12_4_ < uVar3;
        fname.field_2._12_4_ = fname.field_2._12_4_ + 1) {
      pcVar2 = cmsys::Directory::GetFile
                         ((Directory *)&reg.searchstring,(ulong)(uint)fname.field_2._12_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_138,pcVar2,&local_139);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_f8,(string *)local_138);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(files,(value_type *)local_138);
      }
      std::__cxx11::string::~string((string *)local_138);
    }
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_f8);
  cmsys::Directory::~Directory((Directory *)&reg.searchstring);
  return;
}

Assistant:

void cmSystemTools::Glob(const std::string& directory,
                         const std::string& regexp,
                         std::vector<std::string>& files)
{
  cmsys::Directory d;
  cmsys::RegularExpression reg(regexp.c_str());

  if (d.Load(directory)) {
    size_t numf;
    unsigned int i;
    numf = d.GetNumberOfFiles();
    for (i = 0; i < numf; i++) {
      std::string fname = d.GetFile(i);
      if (reg.find(fname)) {
        files.push_back(fname);
      }
    }
  }
}